

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int *activateScaling)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  int expTmp;
  uint local_104;
  int local_100;
  uint local_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float *local_e0;
  float *local_d8;
  long local_d0;
  BeagleCPU4StateImpl<float,_1,_0> *local_c8;
  float *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_100 = 0;
  local_e0 = matrices1;
  local_d8 = matrices2;
  local_c8 = this;
  local_c0 = destP;
  for (local_d0 = 0; local_d0 < (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
      local_d0 = local_d0 + 1) {
    iVar18 = 0;
    auVar21 = vpbroadcastq_avx512vl();
    auVar19 = vpaddq_avx(auVar21._0_16_,_DAT_0014b120);
    vpaddq_avx2(auVar21,_DAT_0014b160);
    auVar22 = vpbroadcastq_avx512vl();
    uVar14 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount * local_100;
    lVar16 = (long)(int)uVar14;
    lVar17 = lVar16 << 2;
    auVar3 = vpermq_avx2(ZEXT1632(auVar19),0xd0);
    auVar3 = vpblendd_avx2(auVar3,auVar21,3);
    vpblendd_avx2(auVar3,auVar22,0xc0);
    vpaddq_avx2(auVar21,_DAT_0014b140);
    vpaddq_avx2(auVar21,_DAT_0014b180);
    local_48 = vgatherqps_avx512vl(*(undefined8 *)(local_e0 + (long)activateScaling));
    auVar25 = ZEXT1664(local_48);
    local_58 = vgatherqps_avx512vl(*(undefined8 *)(local_e0 + uVar14));
    auVar26 = ZEXT1664(local_58);
    local_68 = vgatherqps_avx512vl(*(undefined8 *)(local_e0 + lVar16 * 4));
    auVar27 = ZEXT1664(local_68);
    local_78 = vgatherqps_avx512vl(*(undefined8 *)((long)local_e0 * 5));
    auVar28 = ZEXT1664(local_78);
    local_88 = vgatherqps_avx512vl(*(undefined8 *)(local_d8 + (long)activateScaling));
    auVar29 = ZEXT1664(local_88);
    local_98 = vgatherqps_avx512vl(*(undefined8 *)(local_d8 + uVar14));
    auVar30 = ZEXT1664(local_98);
    local_a8 = vgatherqps_avx512vl(*(undefined8 *)(local_d8 + lVar16 * 4));
    auVar23 = ZEXT1664(local_a8);
    local_b8 = vgatherqps_avx512vl(*(undefined8 *)(local_d8 + (long)local_e0));
    auVar24 = ZEXT1664(local_b8);
    for (; iVar18 < (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount; iVar18 = iVar18 + 1) {
      uVar2 = *(undefined4 *)((long)partials1 + lVar17 + 4);
      auVar19._4_4_ = uVar2;
      auVar19._0_4_ = uVar2;
      auVar19._8_4_ = uVar2;
      auVar19._12_4_ = uVar2;
      auVar19 = vmulps_avx512vl(auVar26._0_16_,auVar19);
      uVar2 = *(undefined4 *)((long)partials2 + lVar17 + 4);
      auVar20._4_4_ = uVar2;
      auVar20._0_4_ = uVar2;
      auVar20._8_4_ = uVar2;
      auVar20._12_4_ = uVar2;
      auVar20 = vmulps_avx512vl(auVar30._0_16_,auVar20);
      uVar2 = *(undefined4 *)((long)partials1 + lVar17);
      auVar4._4_4_ = uVar2;
      auVar4._0_4_ = uVar2;
      auVar4._8_4_ = uVar2;
      auVar4._12_4_ = uVar2;
      auVar19 = vfmadd231ps_avx512vl(auVar19,auVar25._0_16_,auVar4);
      uVar2 = *(undefined4 *)((long)partials2 + lVar17);
      auVar5._4_4_ = uVar2;
      auVar5._0_4_ = uVar2;
      auVar5._8_4_ = uVar2;
      auVar5._12_4_ = uVar2;
      auVar20 = vfmadd231ps_avx512vl(auVar20,auVar29._0_16_,auVar5);
      uVar2 = *(undefined4 *)((long)partials1 + lVar17 + 8);
      auVar6._4_4_ = uVar2;
      auVar6._0_4_ = uVar2;
      auVar6._8_4_ = uVar2;
      auVar6._12_4_ = uVar2;
      auVar19 = vfmadd231ps_avx512vl(auVar19,auVar27._0_16_,auVar6);
      uVar2 = *(undefined4 *)((long)partials2 + lVar17 + 8);
      auVar7._4_4_ = uVar2;
      auVar7._0_4_ = uVar2;
      auVar7._8_4_ = uVar2;
      auVar7._12_4_ = uVar2;
      auVar20 = vfmadd231ps_avx512vl(auVar20,auVar23._0_16_,auVar7);
      uVar2 = *(undefined4 *)((long)partials1 + lVar17 + 0xc);
      auVar8._4_4_ = uVar2;
      auVar8._0_4_ = uVar2;
      auVar8._8_4_ = uVar2;
      auVar8._12_4_ = uVar2;
      auVar19 = vfmadd231ps_avx512vl(auVar19,auVar28._0_16_,auVar8);
      uVar2 = *(undefined4 *)((long)partials2 + lVar17 + 0xc);
      auVar9._4_4_ = uVar2;
      auVar9._0_4_ = uVar2;
      auVar9._8_4_ = uVar2;
      auVar9._12_4_ = uVar2;
      auVar20 = vfmadd231ps_avx512vl(auVar20,auVar24._0_16_,auVar9);
      local_f8 = auVar19._0_4_ * auVar20._0_4_;
      fStack_f4 = auVar19._4_4_ * auVar20._4_4_;
      fStack_f0 = auVar19._8_4_ * auVar20._8_4_;
      fStack_ec = auVar19._12_4_ * auVar20._12_4_;
      pfVar1 = (float *)((long)destP + lVar17);
      *pfVar1 = local_f8;
      pfVar1[1] = fStack_f4;
      pfVar1[2] = fStack_f0;
      pfVar1[3] = fStack_ec;
      if (*activateScaling == 0) {
        frexp((double)local_f8,(int *)&local_fc);
        auVar11._4_4_ = fStack_f4;
        auVar11._0_4_ = local_f8;
        auVar11._8_4_ = fStack_f0;
        auVar11._12_4_ = fStack_ec;
        auVar19 = vmovshdup_avx(auVar11);
        frexp((double)auVar19._0_4_,(int *)&local_104);
        auVar12._4_4_ = fStack_f4;
        auVar12._0_4_ = local_f8;
        auVar12._8_4_ = fStack_f0;
        auVar12._12_4_ = fStack_ec;
        auVar19 = vpermilpd_avx(auVar12,1);
        uVar14 = -local_104;
        if (0 < (int)local_104) {
          uVar14 = local_104;
        }
        uVar15 = -local_fc;
        if (0 < (int)local_fc) {
          uVar15 = local_fc;
        }
        uVar10 = local_fc;
        if (uVar15 < uVar14) {
          uVar10 = local_104;
        }
        frexp((double)auVar19._0_4_,(int *)&local_104);
        auVar13._4_4_ = fStack_f4;
        auVar13._0_4_ = local_f8;
        auVar13._8_4_ = fStack_f0;
        auVar13._12_4_ = fStack_ec;
        auVar19 = vpermilps_avx(auVar13,0xff);
        uVar14 = -local_104;
        if (0 < (int)local_104) {
          uVar14 = local_104;
        }
        uVar15 = -uVar10;
        if (0 < (int)uVar10) {
          uVar15 = uVar10;
        }
        if (uVar15 < uVar14) {
          uVar10 = local_104;
        }
        frexp((double)auVar19._0_4_,(int *)&local_104);
        uVar14 = -local_104;
        if (0 < (int)local_104) {
          uVar14 = local_104;
        }
        uVar15 = -uVar10;
        if (0 < (int)uVar10) {
          uVar15 = uVar10;
        }
        if (uVar15 < uVar14) {
          uVar10 = local_104;
        }
        uVar14 = -uVar10;
        if (0 < (int)uVar10) {
          uVar14 = uVar10;
        }
        if ((local_c8->super_BeagleCPUImpl<float,_1,_0>).scalingExponentThreshold < (int)uVar14) {
          *activateScaling = 1;
        }
        auVar25 = ZEXT1664(local_48);
        auVar26 = ZEXT1664(local_58);
        auVar27 = ZEXT1664(local_68);
        auVar28 = ZEXT1664(local_78);
        auVar29 = ZEXT1664(local_88);
        auVar30 = ZEXT1664(local_98);
        auVar23 = ZEXT1664(local_a8);
        auVar24 = ZEXT1664(local_b8);
        destP = local_c0;
        this = local_c8;
      }
      lVar17 = lVar17 + 0x10;
    }
    local_100 = local_100 + 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                                    const REALTYPE* partials1,
                                                                    const REALTYPE* matrices1,
                                                                    const REALTYPE* partials2,
                                                                    const REALTYPE* matrices2,
                                                                    int* activateScaling) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);
        for (int k = 0; k < kPatternCount; k++) {
            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20;
            destP[u + 1] = sum11 * sum21;
            destP[u + 2] = sum12 * sum22;
            destP[u + 3] = sum13 * sum23;

            if (*activateScaling == 0) {
                int expTmp;
                int expMax;
                frexp(destP[u], &expMax);
                frexp(destP[u + 1], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;
                frexp(destP[u + 2], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;
                frexp(destP[u + 3], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;

                if(abs(expMax) > scalingExponentThreshold) {
                    *activateScaling = 1;
                }
            }

            u += 4;

        }
    }
}